

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O3

void __thiscall
TypeGenericAlias::TypeGenericAlias(TypeGenericAlias *this,InplaceStr name,SynIdentifier *baseName)

{
  uint uVar1;
  
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  (this->super_TypeBase).typeID = 0xd;
  (this->super_TypeBase).name.begin = name.begin;
  (this->super_TypeBase).name.end = name.end;
  (this->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (this->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar1 = NULLC::GetStringHash(name.begin,name.end);
  (this->super_TypeBase).nameHash = uVar1;
  (this->super_TypeBase).importModule = (ModuleData *)0x0;
  (this->super_TypeBase).typeIndex = 0xffffffff;
  (this->super_TypeBase).refType = (TypeRef *)0x0;
  (this->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(this->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(this->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(this->super_TypeBase).padding + 3) = 0;
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_002238d0;
  this->baseName = baseName;
  if (baseName != (SynIdentifier *)0x0) {
    (this->super_TypeBase).isGeneric = true;
    return;
  }
  __assert_fail("baseName",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                ,0x3a5,"TypeGenericAlias::TypeGenericAlias(InplaceStr, SynIdentifier *)");
}

Assistant:

TypeGenericAlias(InplaceStr name, SynIdentifier *baseName): TypeBase(myTypeID, name), baseName(baseName)
	{
		assert(baseName);

		isGeneric = true;
	}